

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

Iterator *
leveldb::NewDBIterator
          (DBImpl *db,Comparator *user_key_comparator,Iterator *internal_iter,
          SequenceNumber sequence,uint32_t seed)

{
  long lVar1;
  int iVar2;
  Iterator *this;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (Iterator *)operator_new(0xa8);
  Iterator::Iterator(this);
  this->_vptr_Iterator = (_func_int **)&PTR__DBIter_00b02350;
  this[1]._vptr_Iterator = (_func_int **)db;
  this[1].cleanup_head_.function = (CleanupFunction)user_key_comparator;
  this[1].cleanup_head_.arg1 = internal_iter;
  this[1].cleanup_head_.arg2 = (void *)sequence;
  this[1].cleanup_head_.next = (CleanupNode *)0x0;
  this[2]._vptr_Iterator = (_func_int **)&this[2].cleanup_head_.arg1;
  this[2].cleanup_head_.function = (CleanupFunction)0x0;
  *(undefined1 *)&this[2].cleanup_head_.arg1 = 0;
  this[2].cleanup_head_.next = &this[3].cleanup_head_;
  this[3]._vptr_Iterator = (_func_int **)0x0;
  *(undefined1 *)&this[3].cleanup_head_.function = 0;
  *(undefined4 *)&this[3].cleanup_head_.arg2 = 0;
  *(undefined1 *)((long)&this[3].cleanup_head_.arg2 + 4) = 0;
  uVar5 = seed & 0x7fffffff;
  if ((uVar5 == 0x7fffffff) || (uVar5 == 0)) {
    uVar5 = 1;
  }
  uVar3 = (uint)((ulong)uVar5 * 0x41a7 >> 0x1f);
  uVar3 = uVar3 << 0x1f | uVar3;
  iVar2 = (int)((ulong)uVar5 * 0x41a7);
  uVar4 = uVar3 + iVar2;
  uVar5 = iVar2 + uVar3 + 0x80000001;
  if (-1 < (int)uVar4) {
    uVar5 = uVar4;
  }
  *(uint *)&this[3].cleanup_head_.next = uVar5;
  this[4]._vptr_Iterator = (_func_int **)(ulong)(uVar5 & 0x1fffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewDBIterator(DBImpl* db, const Comparator* user_key_comparator,
                        Iterator* internal_iter, SequenceNumber sequence,
                        uint32_t seed) {
  return new DBIter(db, user_key_comparator, internal_iter, sequence, seed);
}